

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_ssh1_encrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  uint uVar1;
  uint uVar2;
  uint8_t *p;
  int iVar3;
  uint32_t out [2];
  uint local_30;
  uint local_2c;
  
  if ((len & 7U) == 0) {
    uVar1 = *(uint *)((long)&cipher[-1].vt + 4);
    uVar2 = *(uint *)&cipher[-1].vt;
    if (0 < len) {
      iVar3 = len + 8;
      do {
        blowfish_encrypt(uVar2 ^ *blk,uVar1 ^ *(uint *)((long)blk + 4),&local_30,
                         (BlowfishContext *)(cipher + -0x20a));
        *(char *)blk = (char)local_30;
        *(char *)((long)blk + 1) = (char)(local_30 >> 8);
        *(char *)((long)blk + 2) = (char)(local_30 >> 0x10);
        *(char *)((long)blk + 3) = (char)(local_30 >> 0x18);
        *(char *)((long)blk + 4) = (char)local_2c;
        *(char *)((long)blk + 5) = (char)(local_2c >> 8);
        *(char *)((long)blk + 6) = (char)(local_2c >> 0x10);
        *(char *)((long)blk + 7) = (char)(local_2c >> 0x18);
        blk = (void *)((long)blk + 8);
        iVar3 = iVar3 + -8;
        uVar2 = local_30;
        uVar1 = local_2c;
      } while (8 < iVar3);
    }
    *(uint *)&cipher[-1].vt = uVar2;
    *(uint *)((long)&cipher[-1].vt + 4) = uVar1;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x133,"void blowfish_lsb_encrypt_cbc(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_ssh1_encrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_lsb_encrypt_cbc(blk, len, &ctx->context);
}